

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O1

int regexpTest(char *filename,char *result,char *err,int options)

{
  bool bVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  FILE *pFVar5;
  char *pcVar6;
  FILE *pFVar7;
  char *pcVar8;
  size_t sVar9;
  long lVar10;
  char *__filename;
  ulong uVar11;
  long lVar12;
  byte bVar13;
  undefined4 in_register_0000000c;
  char *extraout_RDX;
  char *pcVar14;
  char *pcVar15;
  long lVar16;
  int iVar17;
  char expression [5000];
  char acStack_4b48 [499];
  undefined1 uStack_4955;
  char acStack_4948 [512];
  char *pcStack_4748;
  char *pcStack_4740;
  code *pcStack_4738;
  undefined8 uStack_4730;
  long lStack_4720;
  long lStack_4718;
  long lStack_4710;
  long lStack_4708;
  undefined8 uStack_4700;
  FILE *pFStack_46f8;
  char *pcStack_46f0;
  undefined8 uStack_46e8;
  char acStack_46e0 [5008];
  long alStack_3350 [1001];
  char *pcStack_1408;
  char *pcStack_1400;
  FILE *pFStack_13f8;
  undefined8 uStack_13f0;
  char *pcStack_13e8;
  undefined8 local_13c0;
  char local_13b8 [5000];
  
  uVar3 = 0;
  xmlSetStructuredErrorFunc(0,testStructuredErrorHandler,err,CONCAT44(in_register_0000000c,options))
  ;
  nb_tests = nb_tests + 1;
  pFVar5 = fopen64(filename,"rb");
  if (pFVar5 == (FILE *)0x0) {
    fprintf(_stderr,"Cannot open %s for reading\n",filename);
  }
  else {
    pcVar14 = "";
    pcVar8 = filename;
    local_13c0 = result;
    pcVar6 = resultFilename(filename,"",".res");
    if (pcVar6 == (char *)0x0) {
      regexpTest_cold_2();
      uStack_13f0 = 0;
      nb_tests = nb_tests + 1;
      pcStack_4738 = (code *)0x10bd7c;
      pcStack_1408 = filename;
      pcStack_1400 = result;
      pFStack_13f8 = pFVar5;
      pcStack_13e8 = err;
      memset(alStack_3350,0,8000);
      pcStack_4738 = (code *)0x10bd8b;
      pFVar5 = fopen64(pcVar8,"rb");
      if (pFVar5 == (FILE *)0x0) {
        pcStack_4738 = (code *)0x10c4d6;
        fprintf(_stderr,"Cannot open %s for reading\n",pcVar8);
      }
      else {
        pcVar15 = "";
        pcStack_4738 = (code *)0x10bdad;
        pcVar6 = pcVar8;
        __filename = resultFilename(pcVar8,"",".res");
        if (__filename == (char *)0x0) {
          pcStack_4738 = resultFilename;
          automataTest_cold_5();
          pcStack_4748 = pcVar8;
          pcStack_4740 = pcVar14;
          pcStack_4738 = (code *)err;
          pcVar6 = baseFilename(pcVar6);
          pcVar8 = ".tmp";
          if (extraout_RDX != (char *)0x0) {
            pcVar8 = extraout_RDX;
          }
          pcVar14 = "";
          if (pcVar15 != (char *)0x0) {
            pcVar14 = pcVar15;
          }
          strncpy(acStack_4948,pcVar8,499);
          iVar4 = snprintf(acStack_4b48,499,"%s%s%s",pcVar14,pcVar6,acStack_4948);
          if (0x1f2 < iVar4) {
            uStack_4955 = 0;
          }
          pcVar8 = strdup(acStack_4b48);
          return (int)pcVar8;
        }
        pcStack_4738 = (code *)0x10bdc8;
        pFVar7 = fopen64(__filename,"wb");
        if (pFVar7 == (FILE *)0x0) {
          pcStack_4738 = (code *)0x10c4e0;
          automataTest_cold_4();
        }
        else {
          pcStack_4738 = (code *)0x10bdd9;
          lVar10 = xmlNewAutomata();
          if (lVar10 == 0) {
            pcStack_4738 = (code *)0x10c4ea;
            automataTest_cold_3();
          }
          else {
            pcStack_4738 = (code *)0x10bded;
            alStack_3350[0] = xmlAutomataGetInitState(lVar10);
            if (alStack_3350[0] != 0) {
              lStack_4710 = 0;
              lStack_4708 = 0;
              pFStack_46f8 = pFVar7;
              pcStack_46f0 = pcVar8;
              uStack_46e8 = pcVar14;
LAB_0010be2e:
              uStack_4700 = 0;
LAB_0010be37:
              do {
                do {
                  pcStack_4738 = (code *)0x10be47;
                  pcVar8 = fgets(acStack_46e0,0x1194,pFVar5);
                  cVar2 = acStack_46e0[0];
                  if (pcVar8 == (char *)0x0) {
LAB_0010c51e:
                    pcStack_4738 = (code *)0x10c528;
                    fclose(pFStack_46f8);
                    pcStack_4738 = (code *)0x10c530;
                    fclose(pFVar5);
                    if (lStack_4708 != 0) {
                      pcStack_4738 = (code *)0x10c53f;
                      xmlRegFreeRegexp();
                    }
                    pcVar8 = uStack_46e8;
                    if (lStack_4710 != 0) {
                      pcStack_4738 = (code *)0x10c553;
                      xmlRegFreeExecCtxt();
                    }
                    if (lVar10 != 0) {
                      pcStack_4738 = (code *)0x10c560;
                      xmlFreeAutomata(lVar10);
                    }
                    pcStack_4738 = (code *)0x10c56b;
                    iVar4 = compareFiles(__filename,pcVar8);
                    if (iVar4 != 0) {
                      pcStack_4738 = (code *)0x10c5b5;
                      fprintf(_stderr,"Result for %s failed in %s\n",pcStack_46f0,pcVar8);
                    }
                    pcStack_4738 = (code *)0x10c579;
                    unlink(__filename);
                    pcStack_4738 = (code *)0x10c581;
                    free(__filename);
                    return (uint)(iVar4 != 0);
                  }
                } while (acStack_46e0[0] == '#');
                pcStack_4738 = (code *)0x10be63;
                sVar9 = strlen(acStack_46e0);
                if (0 < (int)(uint)sVar9) {
                  uVar11 = (ulong)((uint)sVar9 & 0x7fffffff);
                  while (((ulong)(byte)acStack_46e0[uVar11 - 1] < 0x21 &&
                         ((0x100002600U >> ((ulong)(byte)acStack_46e0[uVar11 - 1] & 0x3f) & 1) != 0)
                         )) {
                    sVar9 = uVar11 - 1;
                    bVar1 = (long)uVar11 < 2;
                    uVar11 = sVar9;
                    if (bVar1) goto LAB_0010be8a;
                  }
                  acStack_46e0[uVar11 & 0xffffffff] = '\0';
                  bVar13 = acStack_46e0[1] ^ 0x20;
                  if ((cVar2 == 't' && bVar13 == 0) && lVar10 != 0) {
                    if ((byte)(acStack_46e0[2] - 0x30U) < 10) {
                      iVar4 = 0;
                      pcVar8 = acStack_46e0 + 2;
                      cVar2 = acStack_46e0[2];
                      do {
                        iVar4 = (uint)(byte)(cVar2 - 0x30) + iVar4 * 10;
                        cVar2 = pcVar8[1];
                        pcVar8 = pcVar8 + 1;
                      } while ((byte)(cVar2 - 0x30U) < 10);
                      lVar16 = (long)iVar4;
                    }
                    else {
                      lVar16 = 0;
                      pcVar8 = acStack_46e0 + 2;
                    }
                    if (*pcVar8 == ' ') {
                      if (alStack_3350[lVar16] == 0) {
                        pcStack_4738 = (code *)0x10bf71;
                        lStack_4720 = lVar16;
                        lVar16 = xmlAutomataNewState(lVar10);
                        alStack_3350[lStack_4720] = lVar16;
                        lVar16 = lStack_4720;
                      }
                      cVar2 = pcVar8[1];
                      pcVar8 = pcVar8 + 1;
                      if ((byte)(cVar2 - 0x30U) < 10) {
                        iVar4 = 0;
                        do {
                          iVar4 = (uint)(byte)(cVar2 - 0x30) + iVar4 * 10;
                          cVar2 = pcVar8[1];
                          pcVar8 = pcVar8 + 1;
                        } while ((byte)(cVar2 - 0x30U) < 10);
                        lVar12 = (long)iVar4;
                      }
                      else {
                        lVar12 = 0;
                      }
                      if (*pcVar8 == ' ') {
                        if (alStack_3350[lVar12] == 0) {
                          pcStack_4738 = (code *)0x10c054;
                          lStack_4720 = lVar16;
                          lStack_4718 = lVar12;
                          lVar16 = xmlAutomataNewState(lVar10);
                          alStack_3350[lStack_4718] = lVar16;
                          lVar12 = lStack_4718;
                          lVar16 = lStack_4720;
                        }
                        pcStack_4738 = (code *)0x10c08c;
                        xmlAutomataNewTransition
                                  (lVar10,alStack_3350[lVar16],alStack_3350[lVar12],pcVar8 + 1);
                        goto LAB_0010be37;
                      }
                    }
                  }
                  else {
                    if ((cVar2 == 'e' && bVar13 == 0) && lVar10 != 0) {
                      if ((byte)(acStack_46e0[2] - 0x30U) < 10) {
                        iVar4 = 0;
                        pcVar8 = acStack_46e0 + 2;
                        cVar2 = acStack_46e0[2];
                        do {
                          iVar4 = (uint)(byte)(cVar2 - 0x30) + iVar4 * 10;
                          cVar2 = pcVar8[1];
                          pcVar8 = pcVar8 + 1;
                        } while ((byte)(cVar2 - 0x30U) < 10);
                        lVar16 = (long)iVar4;
                      }
                      else {
                        lVar16 = 0;
                        pcVar8 = acStack_46e0 + 2;
                      }
                      lStack_4720 = CONCAT71(lStack_4720._1_7_,*pcVar8);
                      if (*pcVar8 == ' ') {
                        if (alStack_3350[lVar16] == 0) {
                          pcStack_4738 = (code *)0x10c0bf;
                          lStack_4718 = lVar16;
                          lVar16 = xmlAutomataNewState(lVar10);
                          alStack_3350[lStack_4718] = lVar16;
                          lVar16 = lStack_4718;
                        }
                        cVar2 = pcVar8[1];
                        if ((byte)(cVar2 - 0x30U) < 10) {
                          pcVar8 = pcVar8 + 2;
                          iVar4 = 0;
                          do {
                            iVar4 = (uint)(byte)(cVar2 - 0x30) + iVar4 * 10;
                            cVar2 = *pcVar8;
                            pcVar8 = pcVar8 + 1;
                          } while ((byte)(cVar2 - 0x30U) < 10);
                          lVar12 = (long)iVar4;
                        }
                        else {
                          lVar12 = 0;
                        }
                        if (alStack_3350[lVar12] == 0) {
                          pcStack_4738 = (code *)0x10c16a;
                          lStack_4718 = lVar16;
                          lVar16 = xmlAutomataNewState(lVar10);
                          alStack_3350[lVar12] = lVar16;
                          lVar16 = lStack_4718;
                        }
                        pcStack_4738 = (code *)0x10c18f;
                        xmlAutomataNewEpsilon(lVar10,alStack_3350[lVar16],alStack_3350[lVar12]);
                      }
                      else {
                        pcStack_4738 = (code *)0x10c393;
                        fprintf(_stderr,"Bad line %s\n",acStack_46e0);
                      }
                      if ((char)lStack_4720 != ' ') goto LAB_0010c51e;
                      goto LAB_0010be37;
                    }
                    if ((cVar2 == 'f' && bVar13 == 0) && lVar10 != 0) {
                      uVar11 = 0;
                      if ((byte)(acStack_46e0[2] - 0x30U) < 10) {
                        uVar11 = 0;
                        pcVar8 = acStack_46e0 + 3;
                        cVar2 = acStack_46e0[2];
                        do {
                          uVar11 = (ulong)((uint)(byte)(cVar2 - 0x30) + (int)uVar11 * 10);
                          cVar2 = *pcVar8;
                          pcVar8 = pcVar8 + 1;
                        } while ((byte)(cVar2 - 0x30U) < 10);
                      }
                      if (alStack_3350[(int)uVar11] == 0) {
                        pcStack_4738 = (code *)0x10c3b3;
                        fprintf(_stderr,"Bad state %d : %s\n",uVar11,acStack_46e0);
                        goto LAB_0010c51e;
                      }
                      pcStack_4738 = (code *)0x10c01d;
                      xmlAutomataSetFinalState(lVar10,alStack_3350[(int)uVar11]);
                      goto LAB_0010be37;
                    }
                    if ((cVar2 != 'c' || bVar13 != 0) || lVar10 == 0) {
                      if ((acStack_46e0[1] == 0x2d && cVar2 == '-') && lVar10 != 0) {
                        pcStack_4738 = (code *)0x10c1c9;
                        lVar16 = xmlAutomataCompile(lVar10);
                        pcStack_4738 = (code *)0x10c1d4;
                        xmlFreeAutomata(lVar10);
                        lVar10 = 0;
                        lStack_4708 = lVar16;
                        if (lVar16 != 0) goto LAB_0010be37;
                        pcStack_4738 = (code *)0x10c5c1;
                        automataTest_cold_1();
                        lStack_4708 = 0;
                        lVar10 = 0;
                        goto LAB_0010c51e;
                      }
                      if (acStack_46e0[1] == 0x3e && cVar2 == '=') {
                        iVar4 = (int)uStack_4700;
                        if (lStack_4708 == 0) {
                          pcStack_4738 = (code *)0x10c465;
                          fwrite("=> failed not compiled\n",0x17,1,pFStack_46f8);
                        }
                        else {
                          lVar16 = lStack_4710;
                          if (lStack_4710 == 0) {
                            pcStack_4738 = (code *)0x10c408;
                            lVar16 = xmlRegNewExecCtxt(lStack_4708,0,0);
                          }
                          pFVar7 = pFStack_46f8;
                          if (iVar4 == 0) {
                            pcStack_4738 = (code *)0x10c428;
                            lStack_4710 = lVar16;
                            iVar4 = xmlRegExecPushString(lVar16,0,0);
                            lVar16 = lStack_4710;
                          }
                          if (iVar4 == 1) {
                            sVar9 = 10;
                            pcVar8 = "=> Passed\n";
LAB_0010c49a:
                            pcStack_4738 = (code *)0x10c4a2;
                            fwrite(pcVar8,sVar9,1,pFVar7);
                          }
                          else {
                            if (iVar4 + 1U < 2) {
                              sVar9 = 10;
                              pcVar8 = "=> Failed\n";
                              goto LAB_0010c49a;
                            }
                            if (iVar4 < 0) {
                              sVar9 = 9;
                              pcVar8 = "=> Error\n";
                              goto LAB_0010c49a;
                            }
                          }
                          pcStack_4738 = (code *)0x10c4ad;
                          xmlRegFreeExecCtxt(lVar16);
                          lStack_4710 = 0;
                        }
                        goto LAB_0010be2e;
                      }
                      if (lStack_4708 == 0) {
                        pcStack_4738 = (code *)0x10c3d3;
                        fprintf(_stderr,"Unexpected line %s\n",acStack_46e0);
                        lStack_4708 = 0;
                      }
                      else {
                        if (lStack_4710 == 0) {
                          pcStack_4738 = (code *)0x10c284;
                          lStack_4710 = xmlRegNewExecCtxt(lStack_4708,0,0);
                        }
                        pcStack_4738 = (code *)0x10c296;
                        uStack_4700 = xmlRegExecPushString(lStack_4710,acStack_46e0,0);
                      }
                      goto LAB_0010be37;
                    }
                    if ((byte)(acStack_46e0[2] - 0x30U) < 10) {
                      iVar4 = 0;
                      pcVar8 = acStack_46e0 + 2;
                      cVar2 = acStack_46e0[2];
                      do {
                        iVar4 = (uint)(byte)(cVar2 - 0x30) + iVar4 * 10;
                        cVar2 = pcVar8[1];
                        pcVar8 = pcVar8 + 1;
                      } while ((byte)(cVar2 - 0x30U) < 10);
                      lVar16 = (long)iVar4;
                    }
                    else {
                      lVar16 = 0;
                      pcVar8 = acStack_46e0 + 2;
                    }
                    if (*pcVar8 != ' ') goto LAB_0010c501;
                    if (alStack_3350[lVar16] == 0) {
                      pcStack_4738 = (code *)0x10c216;
                      lStack_4720 = lVar16;
                      lVar16 = xmlAutomataNewState(lVar10);
                      alStack_3350[lStack_4720] = lVar16;
                      lVar16 = lStack_4720;
                    }
                    cVar2 = pcVar8[1];
                    pcVar8 = pcVar8 + 1;
                    if ((byte)(cVar2 - 0x30U) < 10) {
                      iVar4 = 0;
                      do {
                        iVar4 = (uint)(byte)(cVar2 - 0x30) + iVar4 * 10;
                        cVar2 = pcVar8[1];
                        pcVar8 = pcVar8 + 1;
                      } while ((byte)(cVar2 - 0x30U) < 10);
                      lVar12 = (long)iVar4;
                    }
                    else {
                      lVar12 = 0;
                    }
                    if (*pcVar8 == ' ') {
                      if (alStack_3350[lVar12] == 0) {
                        pcStack_4738 = (code *)0x10c2c9;
                        lStack_4720 = lVar16;
                        lStack_4718 = lVar12;
                        lVar16 = xmlAutomataNewState(lVar10);
                        alStack_3350[lStack_4718] = lVar16;
                        lVar12 = lStack_4718;
                        lVar16 = lStack_4720;
                      }
                      cVar2 = pcVar8[1];
                      pcVar8 = pcVar8 + 1;
                      iVar4 = 0;
                      if ((byte)(cVar2 - 0x30U) < 10) {
                        iVar4 = 0;
                        do {
                          iVar4 = (uint)(byte)(cVar2 - 0x30) + iVar4 * 10;
                          cVar2 = pcVar8[1];
                          pcVar8 = pcVar8 + 1;
                        } while ((byte)(cVar2 - 0x30U) < 10);
                      }
                      if (*pcVar8 == ' ') {
                        cVar2 = pcVar8[1];
                        pcVar8 = pcVar8 + 1;
                        iVar17 = 0;
                        if ((byte)(cVar2 - 0x30U) < 10) {
                          iVar17 = 0;
                          do {
                            iVar17 = (uint)(byte)(cVar2 - 0x30) + iVar17 * 10;
                            cVar2 = pcVar8[1];
                            pcVar8 = pcVar8 + 1;
                          } while ((byte)(cVar2 - 0x30U) < 10);
                        }
                        if (*pcVar8 == ' ') {
                          uStack_4730 = 0;
                          pcStack_4738 = (code *)0x10c373;
                          xmlAutomataNewCountTrans
                                    (lVar10,alStack_3350[lVar16],alStack_3350[lVar12],pcVar8 + 1,
                                     iVar4,iVar17);
                          goto LAB_0010be37;
                        }
                      }
                    }
                  }
LAB_0010c501:
                  pcStack_4738 = (code *)0x10c51e;
                  fprintf(_stderr,"Bad line %s\n",acStack_46e0);
                  goto LAB_0010c51e;
                }
LAB_0010be8a:
                acStack_46e0[(int)sVar9] = '\0';
              } while( true );
            }
            pcStack_4738 = (code *)0x10c4f7;
            automataTest_cold_2();
          }
        }
      }
      return -1;
    }
    pFVar7 = fopen64(pcVar6,"wb");
    if (pFVar7 != (FILE *)0x0) {
      lVar10 = 0;
LAB_0010bb0a:
      do {
        pcVar8 = fgets(local_13b8,0x1194,pFVar5);
        if (pcVar8 == (char *)0x0) goto LAB_0010bc4c;
        sVar9 = strlen(local_13b8);
        if (0 < (int)(uint)sVar9) {
          uVar11 = (ulong)((uint)sVar9 & 0x7fffffff);
          do {
            if ((0x20 < (ulong)(byte)local_13b8[uVar11 - 1]) ||
               ((0x100002600U >> ((ulong)(byte)local_13b8[uVar11 - 1] & 0x3f) & 1) == 0)) {
              local_13b8[uVar11 & 0xffffffff] = '\0';
              if (local_13b8[0] == '#') goto LAB_0010bb0a;
              if ((local_13b8[0] == '=') && (local_13b8[1] == '>')) {
                if (lVar10 != 0) {
                  xmlRegFreeRegexp(lVar10);
                }
                fprintf(pFVar7,"Regexp: %s\n",local_13b8 + 2);
                lVar10 = xmlRegexpCompile(local_13b8 + 2);
                if (lVar10 != 0) goto LAB_0010bb0a;
              }
              else {
                if (lVar10 != 0) {
                  uVar3 = xmlRegexpExec(lVar10,local_13b8);
                  if (uVar3 == 0) {
                    pcVar8 = "%s: Fail\n";
                  }
                  else {
                    if (uVar3 != 1) {
                      fprintf(pFVar7,"%s: Error: %d\n",local_13b8,(ulong)uVar3);
                      goto LAB_0010bb0a;
                    }
                    pcVar8 = "%s: Ok\n";
                  }
                  fprintf(pFVar7,pcVar8,local_13b8);
                  goto LAB_0010bb0a;
                }
                fprintf(pFVar7,"Regexp: %s\n",local_13b8);
                lVar10 = xmlRegexpCompile(local_13b8);
                if (lVar10 != 0) goto LAB_0010bb0a;
                lVar10 = 0;
              }
              fwrite("   failed to compile\n",0x15,1,pFVar7);
              goto LAB_0010bc4c;
            }
            sVar9 = uVar11 - 1;
            bVar1 = 1 < (long)uVar11;
            uVar11 = sVar9;
          } while (bVar1);
        }
        local_13b8[(int)sVar9] = '\0';
      } while( true );
    }
    regexpTest_cold_1();
    uVar3 = 0;
  }
LAB_0010bcab:
  xmlSetStructuredErrorFunc(0,0);
  return uVar3;
LAB_0010bc4c:
  fclose(pFVar7);
  fclose(pFVar5);
  if (lVar10 != 0) {
    xmlRegFreeRegexp(lVar10);
  }
  pcVar8 = local_13c0;
  iVar4 = compareFiles(pcVar6,local_13c0);
  if (iVar4 != 0) {
    fprintf(_stderr,"Result for %s failed in %s\n",filename,pcVar8);
  }
  uVar3 = (uint)(iVar4 != 0);
  unlink(pcVar6);
  free(pcVar6);
  iVar4 = compareFileMem(err,testErrors,testErrorsSize);
  if (iVar4 != 0) {
    fprintf(_stderr,"Error for %s failed\n",filename);
    uVar3 = 1;
  }
  goto LAB_0010bcab;
}

Assistant:

static int
regexpTest(const char *filename, const char *result, const char *err,
	   int options ATTRIBUTE_UNUSED) {
    xmlRegexpPtr comp = NULL;
    FILE *input, *output;
    char *temp;
    char expression[5000];
    int len, ret, res = 0;

    /*
     * TODO: Custom error handler for regexp
     */
    xmlSetStructuredErrorFunc(NULL, testStructuredErrorHandler);

    nb_tests++;

    input = fopen(filename, "rb");
    if (input == NULL) {
        fprintf(stderr,
		"Cannot open %s for reading\n", filename);
	ret = -1;
        goto done;
    }
    temp = resultFilename(filename, "", ".res");
    if (temp == NULL) {
        fprintf(stderr, "Out of memory\n");
        fatalError();
    }
    output = fopen(temp, "wb");
    if (output == NULL) {
	fprintf(stderr, "failed to open output file %s\n", temp);
        free(temp);
	ret = -1;
        goto done;
    }
    while (fgets(expression, 4500, input) != NULL) {
	len = strlen(expression);
	len--;
	while ((len >= 0) &&
	       ((expression[len] == '\n') || (expression[len] == '\t') ||
		(expression[len] == '\r') || (expression[len] == ' '))) len--;
	expression[len + 1] = 0;
	if (len >= 0) {
	    if (expression[0] == '#')
		continue;
	    if ((expression[0] == '=') && (expression[1] == '>')) {
		char *pattern = &expression[2];

		if (comp != NULL) {
		    xmlRegFreeRegexp(comp);
		    comp = NULL;
		}
		fprintf(output, "Regexp: %s\n", pattern) ;
		comp = xmlRegexpCompile((const xmlChar *) pattern);
		if (comp == NULL) {
		    fprintf(output, "   failed to compile\n");
		    break;
		}
	    } else if (comp == NULL) {
		fprintf(output, "Regexp: %s\n", expression) ;
		comp = xmlRegexpCompile((const xmlChar *) expression);
		if (comp == NULL) {
		    fprintf(output, "   failed to compile\n");
		    break;
		}
	    } else if (comp != NULL) {
		testRegexp(output, comp, expression);
	    }
	}
    }
    fclose(output);
    fclose(input);
    if (comp != NULL)
	xmlRegFreeRegexp(comp);

    ret = compareFiles(temp, result);
    if (ret) {
        fprintf(stderr, "Result for %s failed in %s\n", filename, result);
        res = 1;
    }
    if (temp != NULL) {
        unlink(temp);
        free(temp);
    }

    ret = compareFileMem(err, testErrors, testErrorsSize);
    if (ret != 0) {
        fprintf(stderr, "Error for %s failed\n", filename);
        res = 1;
    }

done:
    xmlSetStructuredErrorFunc(NULL, NULL);

    return(res);
}